

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearSpeed::ConstraintsBiLoad_Ct(ChLinkMotorLinearSpeed *this,double factor)

{
  undefined1 auVar1 [16];
  ChConstraintTwoBodies *pCVar2;
  char cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  cVar3 = (**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.
                                 super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.
                                 super_ChLinkBase.super_ChPhysicsItem + 0x48))();
  if (cVar3 != '\0') {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                   super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
                   ChTime;
    (*((this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func.
       super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction
      [4])();
    if ((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr < 1)
    {
      __assert_fail("(i >= 0) && (i < nconstr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                    ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
    }
    pCVar2 = *(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.
              constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pCVar2->super_ChConstraintTwo).super_ChConstraint.active == true) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = factor;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (pCVar2->super_ChConstraintTwo).super_ChConstraint.b_i;
      auVar4 = vfnmadd213sd_fma(auVar4,auVar5,auVar1);
      (pCVar2->super_ChConstraintTwo).super_ChConstraint.b_i = auVar4._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkMotorLinearSpeed::ConstraintsBiLoad_Ct(double factor) {
    if (!this->IsActive())
        return;

    double mCt = -m_func->Get_y(this->GetChTime());
    if (mask.Constr_N(0).IsActive()) {
        mask.Constr_N(0).Set_b_i(mask.Constr_N(0).Get_b_i() + factor * mCt);
    }
}